

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O3

bool r_exec::_Fact::Match
               (Code *lhs,uint16_t lhs_base_index,uint16_t lhs_index,Code *rhs,uint16_t rhs_index,
               uint16_t lhs_arity)

{
  undefined1 uVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  uint16_t lhs_base_index_00;
  uint16_t rhs_index_00;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined6 in_register_00000082;
  undefined6 in_register_0000008a;
  Atom rhs_atom;
  Atom lhs_atom;
  undefined4 local_44;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT62(in_register_0000008a,lhs_arity);
  iVar5 = (*(lhs->super__Object)._vptr__Object[5])
                    (lhs,(ulong)((uint)lhs_index + (uint)lhs_base_index & 0xffff));
  local_40 = *(undefined4 *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(rhs->super__Object)._vptr__Object[5])
                    (rhs,CONCAT62(in_register_00000082,rhs_index) & 0xffffffff);
  local_44 = *(undefined4 *)CONCAT44(extraout_var_00,iVar5);
  uVar1 = r_code::Atom::getDescriptor();
  switch(uVar1) {
  case 0x82:
  case 0x83:
  case 0x86:
    break;
  case 0x84:
    bVar2 = r_code::Atom::getDescriptor();
    if ((1 < bVar2 - 0x82) && (bVar2 != 0x86)) {
      if (bVar2 == 0x84) {
        lhs_base_index_00 = r_code::Atom::asIndex();
        rhs_index_00 = r_code::Atom::asIndex();
        bVar3 = MatchStructure(lhs,lhs_base_index_00,0,rhs,rhs_index_00);
LAB_00166152:
        if (bVar3 != false) break;
      }
LAB_001661bb:
      bVar3 = false;
      goto LAB_001661bd;
    }
    break;
  case 0x85:
    bVar2 = r_code::Atom::getDescriptor();
    if ((1 < bVar2 - 0x82) && (bVar2 != 0x86)) {
      if (bVar2 == 0x85) {
        uVar4 = r_code::Atom::asIndex();
        iVar5 = (*(lhs->super__Object)._vptr__Object[9])(lhs,(ulong)uVar4);
        uVar4 = r_code::Atom::asIndex();
        iVar6 = (*(rhs->super__Object)._vptr__Object[9])(rhs,(ulong)uVar4);
        bVar3 = MatchObject((Code *)CONCAT44(extraout_var_01,iVar5),
                            (Code *)CONCAT44(extraout_var_02,iVar6));
        goto LAB_00166152;
      }
      goto LAB_001661bb;
    }
    break;
  default:
    bVar2 = r_code::Atom::getDescriptor();
    if ((4 < bVar2 - 0x82) || ((0x13U >> (bVar2 - 0x82 & 0x1f) & 1) == 0)) {
      local_38 = local_40;
      local_3c = local_44;
      bVar3 = MatchAtom((Atom *)&local_38,(Atom *)&local_3c);
      r_code::Atom::~Atom((Atom *)&local_3c);
      r_code::Atom::~Atom((Atom *)&local_38);
      if (!bVar3) goto LAB_001661bb;
    }
  }
  bVar3 = true;
  if (lhs_index != (uint16_t)local_34) {
    bVar3 = Match(lhs,lhs_base_index,lhs_index + 1,rhs,rhs_index + 1,(uint16_t)local_34);
  }
LAB_001661bd:
  r_code::Atom::~Atom((Atom *)&local_44);
  r_code::Atom::~Atom((Atom *)&local_40);
  return bVar3;
}

Assistant:

bool _Fact::Match(const Code *lhs, uint16_t lhs_base_index, uint16_t lhs_index, const Code *rhs, uint16_t rhs_index, uint16_t lhs_arity)
{
    uint16_t lhs_full_index = lhs_base_index + lhs_index;
    Atom lhs_atom = lhs->code(lhs_full_index);
    Atom rhs_atom = rhs->code(rhs_index);

    switch (lhs_atom.getDescriptor()) {
    case Atom::T_WILDCARD:
    case Atom::WILDCARD:
    case Atom::VL_PTR:
        break;

    case Atom::I_PTR:
        switch (rhs_atom.getDescriptor()) {
        case Atom::I_PTR:
            if (!MatchStructure(lhs, lhs_atom.asIndex(), 0, rhs, rhs_atom.asIndex())) {
                return false;
            }

            break;

        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            return false;
        }

        break;

    case Atom::R_PTR:
        switch (rhs_atom.getDescriptor()) {
        case Atom::R_PTR:
            if (!MatchObject(lhs->get_reference(lhs_atom.asIndex()), rhs->get_reference(rhs_atom.asIndex()))) {
                return false;
            }

            break;

        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            return false;
        }

        break;

    default:
        switch (rhs_atom.getDescriptor()) {
        case Atom::T_WILDCARD:
        case Atom::WILDCARD:
        case Atom::VL_PTR:
            break;

        default:
            if (!MatchAtom(lhs_atom, rhs_atom)) {
                return false;
            }

            break;
        }

        break;
    }

    if (lhs_index == lhs_arity) {
        return true;
    }

    return Match(lhs, lhs_base_index, lhs_index + 1, rhs, rhs_index + 1, lhs_arity);
}